

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HLSL2GLSLConverterImpl.cpp
# Opt level: O3

void __thiscall
Diligent::HLSL2GLSLConverterImpl::ConversionStream::ParseShaderParameter
          (ConversionStream *this,iterator *Token,ShaderParameterInfo *ParamInfo)

{
  uint uVar1;
  String *pSVar2;
  String *pSVar3;
  unordered_map<Diligent::HashMapStringKey,_std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>,_std::hash<Diligent::HashMapStringKey>,_std::equal_to<Diligent::HashMapStringKey>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>_>_>_>
  *this_00;
  _List_node_base **Args_1;
  _List_node_base *p_Var4;
  ConversionStream *pCVar5;
  _List_iterator<Diligent::Parsing::HLSLTokenInfo> _Var6;
  ShaderParameterInfo *pSVar7;
  Char *pCVar8;
  pointer pcVar9;
  _List_node_base *p_Var10;
  iterator iVar11;
  __node_base_ptr p_Var12;
  InterpolationQualifier IVar13;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *Args_1_00;
  char (*Args_1_01) [32];
  char (*Args_1_02) [77];
  int iVar14;
  vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>
  *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  pointer pcVar15;
  _Hash_node_base *p_Var16;
  _List_iterator<Diligent::Parsing::HLSLTokenInfo> _Var17;
  string err_15;
  iterator TypeToken;
  string err;
  String local_158;
  ConversionStream *local_138;
  _List_iterator<Diligent::Parsing::HLSLTokenInfo> local_130;
  _List_node_base *local_128;
  ShaderParameterInfo *local_120;
  undefined1 local_118 [17];
  undefined7 uStack_107;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_100;
  _Alloc_hider local_f0;
  size_type local_e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e0;
  _Alloc_hider local_d0;
  size_type local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c0;
  _Alloc_hider local_b0;
  size_type local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a0;
  vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>
  local_90;
  Char *local_78;
  pointer local_70;
  Char local_68;
  undefined7 uStack_67;
  ulong uStack_60;
  iterator *local_58;
  String local_50;
  
  local_128 = (_List_node_base *)&this->m_Tokens;
  local_130._M_node = Token->_M_node;
  local_138 = this;
  local_120 = ParamInfo;
  if (local_130._M_node == local_128) {
    FormatString<char[43]>
              ((string *)local_118,(char (*) [43])"Unexpected EOF while parsing argument list");
    PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
              (&local_158,local_138,Token,4);
    in_R8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_118;
    LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
              (false,"ParseShaderParameter",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
               ,0x926,in_R8,(char (*) [2])0x6d28c5,&local_158);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_158._M_dataplus._M_p._1_7_,local_158._M_dataplus._M_p._0_1_) !=
        &local_158.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_158._M_dataplus._M_p._1_7_,local_158._M_dataplus._M_p._0_1_),
                      local_158.field_2._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_118._0_8_ != local_118 + 0x10) {
      operator_delete((void *)local_118._0_8_,stack0xfffffffffffffef8 + 1);
    }
    local_130._M_node = Token->_M_node;
  }
  p_Var10 = local_128;
  iVar14 = *(int *)&local_130._M_node[1]._M_next;
  if (iVar14 < 0xf3) {
    if (iVar14 == 0xd2) {
      IVar13 = Centroid;
    }
    else {
      IVar13 = Linear;
      if (iVar14 != 0xf0) goto LAB_002cff3f;
    }
  }
  else if (iVar14 == 0x10b) {
    IVar13 = Sample;
  }
  else if (iVar14 == 0xf4) {
    IVar13 = Noperspective;
  }
  else {
    if (iVar14 != 0xf3) goto LAB_002cff3f;
    IVar13 = Nointerpolation;
  }
  local_120->interpolationQualifier = IVar13;
  p_Var4 = (local_130._M_node)->_M_next;
  std::__cxx11::
  list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>::
  _M_erase((list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>
            *)local_128,(iterator)local_130._M_node);
  Token->_M_node = p_Var4;
  local_130._M_node = p_Var4;
  if (p_Var4 == p_Var10) {
    FormatString<char[43]>
              ((string *)local_118,(char (*) [43])"Unexpected EOF while parsing argument list");
    PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
              (&local_158,local_138,Token,4);
    in_R8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_118;
    LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
              (false,"ParseShaderParameter",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
               ,0x92f,in_R8,(char (*) [2])0x6d28c5,&local_158);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_158._M_dataplus._M_p._1_7_,local_158._M_dataplus._M_p._0_1_) !=
        &local_158.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_158._M_dataplus._M_p._1_7_,local_158._M_dataplus._M_p._0_1_),
                      local_158.field_2._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_118._0_8_ != local_118 + 0x10) {
      operator_delete((void *)local_118._0_8_,stack0xfffffffffffffef8 + 1);
    }
    local_130._M_node = Token->_M_node;
  }
LAB_002cff3f:
  uVar1 = *(int *)&local_130._M_node[1]._M_next - 1;
  Args_1_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              (ulong)CONCAT31((int3)(uVar1 >> 8),uVar1 < 0xbf);
  if (*(int *)&local_130._M_node[1]._M_next != 0x13b && uVar1 >= 0xbf) {
    FormatString<char[22]>((string *)local_118,(char (*) [22])"Missing argument type");
    PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
              (&local_158,local_138,Token,4);
    in_R8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_118;
    Args_1_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x933;
    LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
              (false,"ParseShaderParameter",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
               ,0x933,in_R8,(char (*) [2])0x6d28c5,&local_158);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_158._M_dataplus._M_p._1_7_,local_158._M_dataplus._M_p._0_1_) !=
        &local_158.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_158._M_dataplus._M_p._1_7_,local_158._M_dataplus._M_p._0_1_),
                      local_158.field_2._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_118._0_8_ != local_118 + 0x10) {
      operator_delete((void *)local_118._0_8_,stack0xfffffffffffffef8 + 1);
    }
    local_130._M_node = Token->_M_node;
  }
  pSVar7 = local_120;
  pSVar2 = &local_120->Type;
  std::__cxx11::string::_M_assign((string *)pSVar2);
  if (pSVar7->storageQualifier != Ret) {
    p_Var10 = Token->_M_node->_M_next;
    Token->_M_node = p_Var10;
    if (p_Var10 == local_128) {
      FormatString<char[43]>
                ((string *)local_118,(char (*) [43])"Unexpected EOF while parsing argument list");
      PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
                (&local_158,local_138,Token,4);
      in_R8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_118;
      Args_1_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x93c;
      LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
                (false,"ParseShaderParameter",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                 ,0x93c,in_R8,(char (*) [2])0x6d28c5,&local_158);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_158._M_dataplus._M_p._1_7_,local_158._M_dataplus._M_p._0_1_) !=
          &local_158.field_2) {
        operator_delete((undefined1 *)
                        CONCAT71(local_158._M_dataplus._M_p._1_7_,local_158._M_dataplus._M_p._0_1_),
                        local_158.field_2._M_allocated_capacity + 1);
      }
      if ((undefined1 *)local_118._0_8_ != local_118 + 0x10) {
        operator_delete((void *)local_118._0_8_,stack0xfffffffffffffef8 + 1);
      }
      p_Var10 = Token->_M_node;
    }
    if (*(int *)&p_Var10[1]._M_next != 0x13b) {
      FormatString<char[29],std::__cxx11::string>
                ((string *)local_118,(Diligent *)"Missing argument name after ",
                 (char (*) [29])pSVar2,Args_1_00);
      PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
                (&local_158,local_138,Token,4);
      in_R8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_118;
      LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
                (false,"ParseShaderParameter",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                 ,0x93d,in_R8,(char (*) [2])0x6d28c5,&local_158);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_158._M_dataplus._M_p._1_7_,local_158._M_dataplus._M_p._0_1_) !=
          &local_158.field_2) {
        operator_delete((undefined1 *)
                        CONCAT71(local_158._M_dataplus._M_p._1_7_,local_158._M_dataplus._M_p._0_1_),
                        local_158.field_2._M_allocated_capacity + 1);
      }
      if ((undefined1 *)local_118._0_8_ != local_118 + 0x10) {
        operator_delete((void *)local_118._0_8_,stack0xfffffffffffffef8 + 1);
      }
    }
    pSVar2 = &local_120->Name;
    std::__cxx11::string::_M_assign((string *)pSVar2);
    p_Var10 = Token->_M_node->_M_next;
    Token->_M_node = p_Var10;
    if (p_Var10 == local_128) {
      FormatString<char[15]>((string *)local_118,(char (*) [15])"Unexpected EOF");
      PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
                (&local_158,local_138,Token,4);
      in_R8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_118;
      LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
                (false,"ParseShaderParameter",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                 ,0x941,in_R8,(char (*) [2])0x6d28c5,&local_158);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_158._M_dataplus._M_p._1_7_,local_158._M_dataplus._M_p._0_1_) !=
          &local_158.field_2) {
        operator_delete((undefined1 *)
                        CONCAT71(local_158._M_dataplus._M_p._1_7_,local_158._M_dataplus._M_p._0_1_),
                        local_158.field_2._M_allocated_capacity + 1);
      }
      if ((undefined1 *)local_118._0_8_ != local_118 + 0x10) {
        operator_delete((void *)local_118._0_8_,stack0xfffffffffffffef8 + 1);
      }
      p_Var10 = Token->_M_node;
    }
    if (*(int *)&p_Var10[1]._M_next == 0x137) {
      p_Var10 = p_Var10->_M_next;
      Token->_M_node = p_Var10;
      if (p_Var10 != local_128) {
        pSVar3 = &local_120->ArraySize;
        iVar14 = 1;
        do {
          if (*(int *)&p_Var10[1]._M_next == 0x138) {
            if (iVar14 < 2) {
              if (p_Var10 != local_128) goto LAB_002d0379;
              break;
            }
            iVar14 = iVar14 + -1;
          }
          else if (*(int *)&p_Var10[1]._M_next == 0x137) {
            iVar14 = iVar14 + 1;
          }
          std::__cxx11::string::_M_append((char *)pSVar3,(ulong)p_Var10[3]._M_prev);
          std::__cxx11::string::_M_append((char *)pSVar3,(ulong)Token->_M_node[1]._M_prev);
          p_Var10 = Token->_M_node->_M_next;
          Token->_M_node = p_Var10;
        } while (p_Var10 != local_128);
      }
      FormatString<char[38]>
                ((string *)local_118,(char (*) [38])"Unexpected EOF while processing scope");
      PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
                (&local_158,local_138,Token,4);
      in_R8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_118;
      Args_1_01 = (char (*) [32])0xd1e;
      LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
                (false,"ProcessScope",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                 ,0xd1e,in_R8,(char (*) [2])0x6d28c5,&local_158);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_158._M_dataplus._M_p._1_7_,local_158._M_dataplus._M_p._0_1_) !=
          &local_158.field_2) {
        operator_delete((undefined1 *)
                        CONCAT71(local_158._M_dataplus._M_p._1_7_,local_158._M_dataplus._M_p._0_1_),
                        local_158.field_2._M_allocated_capacity + 1);
      }
      if ((undefined1 *)local_118._0_8_ != local_118 + 0x10) {
        operator_delete((void *)local_118._0_8_,stack0xfffffffffffffef8 + 1);
      }
      p_Var10 = Token->_M_node;
      if (*(int *)&p_Var10[1]._M_next != 0x138) {
        FormatString<char[26],char[32]>
                  ((string *)local_118,(Diligent *)"Debug expression failed:\n",
                   (char (*) [26])"Token->Type == ClosingParenType",Args_1_01);
        DebugAssertionFailed
                  ((Char *)local_118._0_8_,"ProcessScope",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                   ,0xd1f);
        if ((undefined1 *)local_118._0_8_ != local_118 + 0x10) {
          operator_delete((void *)local_118._0_8_,stack0xfffffffffffffef8 + 1);
        }
        p_Var10 = Token->_M_node;
      }
LAB_002d0379:
      if (p_Var10 == local_128) {
        FormatString<char[15]>((string *)local_118,(char (*) [15])"Unexpected EOF");
        PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
                  (&local_158,local_138,Token,4);
        in_R8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_118;
        LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
                  (false,"ParseShaderParameter",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                   ,0x94f,in_R8,(char (*) [2])0x6d28c5,&local_158);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(local_158._M_dataplus._M_p._1_7_,local_158._M_dataplus._M_p._0_1_) !=
            &local_158.field_2) {
          operator_delete((undefined1 *)
                          CONCAT71(local_158._M_dataplus._M_p._1_7_,local_158._M_dataplus._M_p._0_1_
                                  ),local_158.field_2._M_allocated_capacity + 1);
        }
        if ((undefined1 *)local_118._0_8_ != local_118 + 0x10) {
          operator_delete((void *)local_118._0_8_,stack0xfffffffffffffef8 + 1);
        }
        p_Var10 = Token->_M_node;
      }
      if (*(int *)&p_Var10[1]._M_next != 0x138) {
        FormatString<char[24]>((string *)local_118,(char (*) [24])"Closing staple expected");
        PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
                  (&local_158,local_138,Token,4);
        in_R8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_118;
        LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
                  (false,"ParseShaderParameter",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                   ,0x952,in_R8,(char (*) [2])0x6d28c5,&local_158);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(local_158._M_dataplus._M_p._1_7_,local_158._M_dataplus._M_p._0_1_) !=
            &local_158.field_2) {
          operator_delete((undefined1 *)
                          CONCAT71(local_158._M_dataplus._M_p._1_7_,local_158._M_dataplus._M_p._0_1_
                                  ),local_158.field_2._M_allocated_capacity + 1);
        }
        if ((undefined1 *)local_118._0_8_ != local_118 + 0x10) {
          operator_delete((void *)local_118._0_8_,stack0xfffffffffffffef8 + 1);
        }
        p_Var10 = Token->_M_node;
      }
      p_Var10 = p_Var10->_M_next;
      Token->_M_node = p_Var10;
      if (p_Var10 == local_128) {
        FormatString<char[15]>((string *)local_118,(char (*) [15])"Unexpected EOF");
        PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
                  (&local_158,local_138,Token,4);
        in_R8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_118;
        LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
                  (false,"ParseShaderParameter",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                   ,0x955,in_R8,(char (*) [2])0x6d28c5,&local_158);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(local_158._M_dataplus._M_p._1_7_,local_158._M_dataplus._M_p._0_1_) !=
            &local_158.field_2) {
          operator_delete((undefined1 *)
                          CONCAT71(local_158._M_dataplus._M_p._1_7_,local_158._M_dataplus._M_p._0_1_
                                  ),local_158.field_2._M_allocated_capacity + 1);
        }
        if ((undefined1 *)local_118._0_8_ != local_118 + 0x10) {
          operator_delete((void *)local_118._0_8_,stack0xfffffffffffffef8 + 1);
        }
        p_Var10 = Token->_M_node;
      }
      if (*(int *)&p_Var10[1]._M_next == 0x137) {
        FormatString<char[43]>
                  ((string *)local_118,(char (*) [43])"Multi-dimensional arrays are not supported");
        PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
                  (&local_158,local_138,Token,4);
        in_R8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_118;
        LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
                  (false,"ParseShaderParameter",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                   ,0x956,in_R8,(char (*) [2])0x6d28c5,&local_158);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(local_158._M_dataplus._M_p._1_7_,local_158._M_dataplus._M_p._0_1_) !=
            &local_158.field_2) {
          operator_delete((undefined1 *)
                          CONCAT71(local_158._M_dataplus._M_p._1_7_,local_158._M_dataplus._M_p._0_1_
                                  ),local_158.field_2._M_allocated_capacity + 1);
        }
        if ((undefined1 *)local_118._0_8_ != local_118 + 0x10) {
          operator_delete((void *)local_118._0_8_,stack0xfffffffffffffef8 + 1);
        }
      }
    }
    if (*(int *)&local_130._M_node[1]._M_next - 1U < 0xbf) {
      p_Var10 = Token->_M_node;
      if (p_Var10 == local_128) {
        local_158._M_dataplus._M_p._0_1_ = 0x22;
        FormatString<char[40],std::__cxx11::string,char>
                  ((string *)local_118,(Diligent *)"Unexpected end of file after argument \"",
                   (char (*) [40])pSVar2,&local_158,(char *)in_R8);
        PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
                  (&local_158,local_138,Token,4);
        in_R8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_118;
        LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
                  (false,"ParseShaderParameter",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                   ,0x95d,in_R8,(char (*) [2])0x6d28c5,&local_158);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(local_158._M_dataplus._M_p._1_7_,local_158._M_dataplus._M_p._0_1_) !=
            &local_158.field_2) {
          operator_delete((undefined1 *)
                          CONCAT71(local_158._M_dataplus._M_p._1_7_,local_158._M_dataplus._M_p._0_1_
                                  ),local_158.field_2._M_allocated_capacity + 1);
        }
        if ((undefined1 *)local_118._0_8_ != local_118 + 0x10) {
          operator_delete((void *)local_118._0_8_,stack0xfffffffffffffef8 + 1);
        }
        p_Var10 = Token->_M_node;
      }
      iVar14 = std::__cxx11::string::compare((char *)&p_Var10[1]._M_prev);
      if (iVar14 == 0) {
        p_Var10 = Token->_M_node->_M_next;
        Token->_M_node = p_Var10;
        if (p_Var10 == local_128) {
          local_158._M_dataplus._M_p._0_1_ = 0x22;
          FormatString<char[65],std::__cxx11::string,char>
                    ((string *)local_118,
                     (Diligent *)"Unexpected end of file while looking for semantic for argument \""
                     ,(char (*) [65])pSVar2,&local_158,(char *)in_R8);
          PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
                    (&local_158,local_138,Token,4);
          in_R8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_118;
          LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
                    (false,"ParseShaderParameter",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                     ,0x963,in_R8,(char (*) [2])0x6d28c5,&local_158);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT71(local_158._M_dataplus._M_p._1_7_,local_158._M_dataplus._M_p._0_1_) !=
              &local_158.field_2) {
            operator_delete((undefined1 *)
                            CONCAT71(local_158._M_dataplus._M_p._1_7_,
                                     local_158._M_dataplus._M_p._0_1_),
                            local_158.field_2._M_allocated_capacity + 1);
          }
          if ((undefined1 *)local_118._0_8_ != local_118 + 0x10) {
            operator_delete((void *)local_118._0_8_,stack0xfffffffffffffef8 + 1);
          }
          p_Var10 = Token->_M_node;
        }
        if (*(int *)&p_Var10[1]._M_next != 0x13b) {
          local_158._M_dataplus._M_p._0_1_ = 0x22;
          FormatString<char[32],std::__cxx11::string,char>
                    ((string *)local_118,(Diligent *)"Missing semantic for argument \"",
                     (char (*) [32])pSVar2,&local_158,(char *)in_R8);
          PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
                    (&local_158,local_138,Token,4);
          LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
                    (false,"ParseShaderParameter",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                     ,0x964,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_118,(char (*) [2])0x6d28c5,&local_158);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT71(local_158._M_dataplus._M_p._1_7_,local_158._M_dataplus._M_p._0_1_) !=
              &local_158.field_2) {
            operator_delete((undefined1 *)
                            CONCAT71(local_158._M_dataplus._M_p._1_7_,
                                     local_158._M_dataplus._M_p._0_1_),
                            local_158.field_2._M_allocated_capacity + 1);
          }
          if ((undefined1 *)local_118._0_8_ != local_118 + 0x10) {
            operator_delete((void *)local_118._0_8_,stack0xfffffffffffffef8 + 1);
          }
          p_Var10 = Token->_M_node;
        }
        local_78 = &local_68;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_78,p_Var10[1]._M_prev,
                   (long)&(p_Var10[1]._M_prev)->_M_next + (long)p_Var10[2]._M_next);
        pcVar9 = local_70;
        pCVar8 = local_78;
        if (local_70 != (pointer)0x0) {
          pcVar15 = (pointer)0x0;
          do {
            iVar14 = tolower((uint)(byte)pCVar8[(long)pcVar15]);
            pCVar8[(long)pcVar15] = (Char)iVar14;
            pcVar15 = pcVar15 + 1;
          } while (pcVar9 != pcVar15);
        }
        local_118._0_8_ = local_78;
        if (local_78 == &local_68) {
          aStack_100._0_8_ = uStack_60;
          local_118._0_8_ = local_118 + 0x10;
        }
        uStack_107 = uStack_67;
        local_118[0x10] = local_68;
        local_118._8_8_ = local_70;
        local_70 = (pointer)0x0;
        local_68 = '\0';
        local_78 = &local_68;
        std::__cxx11::string::operator=((string *)&local_120->Semantic,(string *)local_118);
        if ((undefined1 *)local_118._0_8_ != local_118 + 0x10) {
          operator_delete((void *)local_118._0_8_,stack0xfffffffffffffef8 + 1);
        }
        if (local_78 != &local_68) {
          operator_delete(local_78,CONCAT71(uStack_67,local_68) + 1);
        }
        Token->_M_node = Token->_M_node->_M_next;
      }
    }
  }
  if (0xbe < *(int *)&local_130._M_node[1]._M_next - 1U) {
    local_58 = Token;
    iVar11 = FindMacroDefinition(local_138,(string *)&local_130._M_node[1]._M_prev);
    pCVar5 = local_138;
    if ((iVar11._M_node != local_128) && (iVar11._M_node[5]._M_prev < local_130._M_node[5]._M_prev))
    {
      local_130._M_node = iVar11._M_node;
    }
    _Var6._M_node = local_130._M_node;
    this_00 = &local_138->m_StructDefinitions;
    HashMapStringKey::HashMapStringKey
              ((HashMapStringKey *)local_118,(Char *)local_130._M_node[1]._M_prev,false);
    Args_1_02 = (char (*) [77])(local_118._8_8_ & 0x7fffffffffffffff);
    p_Var12 = std::
              _Hashtable<Diligent::HashMapStringKey,_std::pair<const_Diligent::HashMapStringKey,_std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>_>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>_>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::HashMapStringKey>,_std::hash<Diligent::HashMapStringKey>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::_M_find_before_node
                        (&this_00->_M_h,
                         (ulong)Args_1_02 % (pCVar5->m_StructDefinitions)._M_h._M_bucket_count,
                         (HashMapStringKey *)local_118,(__hash_code)Args_1_02);
    if (p_Var12 == (__node_base_ptr)0x0) {
      p_Var16 = (_Hash_node_base *)0x0;
    }
    else {
      p_Var16 = p_Var12->_M_nxt;
    }
    if (((Char *)local_118._0_8_ != (Char *)0x0) && ((long)local_118._8_8_ < 0)) {
      operator_delete__((void *)local_118._0_8_);
    }
    Args_1 = &_Var6._M_node[1]._M_prev;
    if (p_Var16 == (_Hash_node_base *)0x0) {
      Args_1_02 = (char (*) [77])0x97c;
      LogError<true,char[37],std::__cxx11::string,char[2]>
                (false,"ParseShaderParameter",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                 ,0x97c,(char (*) [37])"Unable to find definition for type \'",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)Args_1,
                 (char (*) [2])0x6a0dd3);
    }
    _Var17._M_node = (_List_node_base *)p_Var16[3]._M_nxt;
    local_130._M_node = _Var17._M_node;
    if (((*(int *)&_Var17._M_node[1]._M_next != 0x13b) ||
        (p_Var10 = _Var17._M_node[2]._M_next, p_Var10 != _Var6._M_node[2]._M_next)) ||
       ((p_Var10 != (_List_node_base *)0x0 &&
        (iVar14 = bcmp(_Var17._M_node[1]._M_prev,*Args_1,(size_t)p_Var10), iVar14 != 0)))) {
      FormatString<char[26],char[77]>
                ((string *)local_118,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])
                 "TypeToken->Type == TokenType::Identifier && TypeToken->Literal == StructName",
                 Args_1_02);
      DebugAssertionFailed
                ((Char *)local_118._0_8_,"ParseShaderParameter",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                 ,0x981);
      _Var17._M_node = local_130._M_node;
      if ((undefined1 *)local_118._0_8_ != local_118 + 0x10) {
        operator_delete((void *)local_118._0_8_,stack0xfffffffffffffef8 + 1);
        _Var17._M_node = local_130._M_node;
      }
    }
    local_130._M_node = (_Var17._M_node)->_M_next;
    if ((local_130._M_node == local_128) || (*(int *)&local_130._M_node[1]._M_next != 0x133)) {
      FormatString<char[20]>((string *)local_118,(char (*) [20])"Open brace expected");
      PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
                (&local_158,local_138,&local_130,4);
      LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
                (false,"ParseShaderParameter",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                 ,0x987,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_118,(char (*) [2])0x6d28c5,&local_158);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_158._M_dataplus._M_p._1_7_,local_158._M_dataplus._M_p._0_1_) !=
          &local_158.field_2) {
        operator_delete((undefined1 *)
                        CONCAT71(local_158._M_dataplus._M_p._1_7_,local_158._M_dataplus._M_p._0_1_),
                        local_158.field_2._M_allocated_capacity + 1);
      }
      if ((undefined1 *)local_118._0_8_ != local_118 + 0x10) {
        operator_delete((void *)local_118._0_8_,stack0xfffffffffffffef8 + 1);
      }
    }
    local_130._M_node = (local_130._M_node)->_M_next;
    if (local_130._M_node != local_128) {
      this_01 = &local_120->members;
      do {
        if (*(int *)&local_130._M_node[1]._M_next == 0x134) {
          return;
        }
        local_118._0_8_ = local_118._0_8_ & 0xffffff0000000000;
        stack0xfffffffffffffef8 = 0;
        aStack_100._0_8_ = aStack_100._0_8_ & 0xffffffffffffff00;
        local_f0._M_p = (pointer)&local_e0;
        local_e8 = 0;
        local_e0._M_local_buf[0] = '\0';
        local_d0._M_p = (pointer)&local_c0;
        local_c8 = 0;
        local_c0._M_local_buf[0] = '\0';
        local_b0._M_p = (pointer)&local_a0;
        local_a8 = 0;
        local_a0._M_local_buf[0] = '\0';
        local_90.
        super__Vector_base<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_90.
        super__Vector_base<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_90.
        super__Vector_base<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_118._8_8_ = &aStack_100;
        ParseShaderParameter(local_138,&local_130,(ShaderParameterInfo *)local_118);
        local_118[0] = local_120->storageQualifier;
        std::
        vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>
        ::emplace_back<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>
                  (this_01,(ShaderParameterInfo *)local_118);
        if ((local_58->_M_node == local_128) || (*(int *)&local_130._M_node[1]._M_next != 0x13e)) {
          FormatString<char[19]>(&local_158,(char (*) [19])"Semicolon expected");
          PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
                    (&local_50,local_138,&local_130,4);
          LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
                    (false,"ParseShaderParameter",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                     ,0x99b,&local_158,(char (*) [2])0x6d28c5,&local_50);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT71(local_158._M_dataplus._M_p._1_7_,local_158._M_dataplus._M_p._0_1_) !=
              &local_158.field_2) {
            operator_delete((undefined1 *)
                            CONCAT71(local_158._M_dataplus._M_p._1_7_,
                                     local_158._M_dataplus._M_p._0_1_),
                            local_158.field_2._M_allocated_capacity + 1);
          }
        }
        local_130._M_node = (local_130._M_node)->_M_next;
        std::
        vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>
        ::~vector(&local_90);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_p != &local_a0) {
          operator_delete(local_b0._M_p,
                          CONCAT71(local_a0._M_allocated_capacity._1_7_,local_a0._M_local_buf[0]) +
                          1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._M_p != &local_c0) {
          operator_delete(local_d0._M_p,
                          CONCAT71(local_c0._M_allocated_capacity._1_7_,local_c0._M_local_buf[0]) +
                          1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f0._M_p != &local_e0) {
          operator_delete(local_f0._M_p,
                          CONCAT71(local_e0._M_allocated_capacity._1_7_,local_e0._M_local_buf[0]) +
                          1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_118._8_8_ != &aStack_100) {
          operator_delete((void *)local_118._8_8_,aStack_100._0_8_ + 1);
        }
      } while (local_130._M_node != local_128);
    }
  }
  return;
}

Assistant:

void HLSL2GLSLConverterImpl::ConversionStream::ParseShaderParameter(TokenListType::iterator& Token, ShaderParameterInfo& ParamInfo)
{
    VERIFY_PARSER_STATE(Token, Token != m_Tokens.end(), "Unexpected EOF while parsing argument list");

    if (ParamInfo.SetInterpolationQualifier(Token->Type))
    {
        //          out noperspective float4 Color : SV_Target,
        //              ^
        Token = m_Tokens.erase(Token);
        //          out float4 Color : SV_Target,
        //              ^
        VERIFY_PARSER_STATE(Token, Token != m_Tokens.end(), "Unexpected EOF while parsing argument list");
    }

    VERIFY_PARSER_STATE(Token, Token->IsBuiltInType() || Token->Type == TokenType::Identifier,
                        "Missing argument type");
    auto TypeToken = Token;
    ParamInfo.Type = Token->Literal;

    if (ParamInfo.storageQualifier != ShaderParameterInfo::StorageQualifier::Ret)
    {
        ++Token;
        //          out float4 Color : SV_Target,
        //                     ^
        VERIFY_PARSER_STATE(Token, Token != m_Tokens.end(), "Unexpected EOF while parsing argument list");
        VERIFY_PARSER_STATE(Token, Token->Type == TokenType::Identifier, "Missing argument name after ", ParamInfo.Type);
        ParamInfo.Name = Token->Literal;

        ++Token;
        VERIFY_PARSER_STATE(Token, Token != m_Tokens.end(), "Unexpected EOF");

        if (Token->Type == TokenType::OpenSquareBracket)
        {
            // triangle VSOut In[3]
            //                  ^
            ProcessScope(
                Token, m_Tokens.end(), TokenType::OpenSquareBracket, TokenType::ClosingSquareBracket,
                [&](TokenListType::iterator& tkn, int) {
                    ParamInfo.ArraySize.append(tkn->Delimiter);
                    ParamInfo.ArraySize.append(tkn->Literal);
                    ++tkn;
                } //
            );
            VERIFY_PARSER_STATE(Token, Token != m_Tokens.end(), "Unexpected EOF");
            // triangle VSOut In[3],
            //                    ^
            VERIFY_PARSER_STATE(Token, Token->Type == TokenType::ClosingSquareBracket, "Closing staple expected");

            ++Token;
            VERIFY_PARSER_STATE(Token, Token != m_Tokens.end(), "Unexpected EOF");
            VERIFY_PARSER_STATE(Token, Token->Type != TokenType::OpenSquareBracket, "Multi-dimensional arrays are not supported");
        }

        if (TypeToken->IsBuiltInType())
        {
            //          out float4 Color : SV_Target,
            //                           ^
            VERIFY_PARSER_STATE(Token, Token != m_Tokens.end(), "Unexpected end of file after argument \"", ParamInfo.Name, '\"');
            if (Token->Literal == ":")
            {
                ++Token;
                //          out float4 Color : SV_Target,
                //                             ^
                VERIFY_PARSER_STATE(Token, Token != m_Tokens.end(), "Unexpected end of file while looking for semantic for argument \"", ParamInfo.Name, '\"');
                VERIFY_PARSER_STATE(Token, Token->Type == TokenType::Identifier, "Missing semantic for argument \"", ParamInfo.Name, '\"');
                // Transform to lower case -  semantics are case-insensitive
                ParamInfo.Semantic = StrToLower(Token->Literal);

                ++Token;
                //          out float4 Color : SV_Target,
                //                                      ^
            }
        }
    }

    if (!TypeToken->IsBuiltInType())
    {
        {
            auto DefinedTypeToken = FindMacroDefinition(TypeToken->Literal);
            // Check that the define directive is before the type token
            if (DefinedTypeToken != m_Tokens.end() && DefinedTypeToken->Idx < TypeToken->Idx)
            {
                TypeToken = DefinedTypeToken;
            }
        }
        const auto& StructName = TypeToken->Literal;
        auto        it         = m_StructDefinitions.find(StructName.c_str());
        if (it == m_StructDefinitions.end())
            LOG_ERROR_AND_THROW("Unable to find definition for type \'", StructName, "\'");

        TypeToken = it->second;
        // struct VSOutput
        //        ^
        VERIFY_EXPR(TypeToken->Type == TokenType::Identifier && TypeToken->Literal == StructName);

        ++TypeToken;
        // struct VSOutput
        // {
        // ^
        VERIFY_PARSER_STATE(TypeToken, TypeToken != m_Tokens.end() && TypeToken->Type == TokenType::OpenBrace, "Open brace expected");

        ++TypeToken;
        // struct VSOutput
        // {
        //     float4 f4Position;
        //     ^
        while (TypeToken != m_Tokens.end() && TypeToken->Type != TokenType::ClosingBrace)
        {
            ShaderParameterInfo MemberInfo;
            ParseShaderParameter(TypeToken, MemberInfo);
            // Set storage qualifier after we process the member as otherwise
            // members of a struct with the StorageQualifier::Ret qualifier
            // will not be processed.
            MemberInfo.storageQualifier = ParamInfo.storageQualifier;
            ParamInfo.members.emplace_back(std::move(MemberInfo));
            // struct VSOutput
            // {
            //     float4 f4Position;
            //                      ^
            VERIFY_PARSER_STATE(TypeToken, Token != m_Tokens.end() && TypeToken->Type == TokenType::Semicolon, "Semicolon expected");
            ++TypeToken;
        }
    }
}